

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

bool __thiscall
docopt::Required::match
          (Required *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  *in_RDI;
  bool ret;
  shared_ptr<docopt::Pattern> *pattern;
  const_iterator __end1;
  const_iterator __begin1;
  PatternList *__range1;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  c;
  PatternList l;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_70;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  *local_68;
  undefined1 local_50 [8];
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *in_stack_ffffffffffffffb8;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_38 [55];
  byte local_1;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_ffffffffffffffc0,
           (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_ffffffffffffffb8);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_68 = in_RDI + 1;
  local_70._M_current =
       (shared_ptr<docopt::Pattern> *)
       std::
       vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (!bVar1) {
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      operator=((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 *)in_stack_ffffffffffffff80,
                (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::operator=(in_stack_ffffffffffffff80,
                  (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_1 = 1;
LAB_002b39e7:
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::~vector(in_stack_ffffffffffffff80);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)in_stack_ffffffffffffff80);
      return (bool)(local_1 & 1);
    }
    in_stack_ffffffffffffff80 =
         (vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
            ::operator*(&local_70);
    peVar3 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2b3939);
    iVar2 = (*peVar3->_vptr_Pattern[2])(peVar3,local_38,local_50);
    in_stack_ffffffffffffff6f = (undefined1)iVar2;
    in_stack_ffffffffffffff7c =
         CONCAT13(in_stack_ffffffffffffff6f,(int3)in_stack_ffffffffffffff7c) & 0x1ffffff;
    if ((char)(in_stack_ffffffffffffff7c >> 0x18) == '\0') {
      local_1 = 0;
      goto LAB_002b39e7;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
    ::operator++(&local_70);
  } while( true );
}

Assistant:

bool Required::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
{
	auto l = left;
	auto c = collected;
	
	for(auto const& pattern : fChildren) {
		bool ret = pattern->match(l, c);
		if (!ret) {
			// leave (left, collected) untouched
			return false;
		}
	}
	
	left = std::move(l);
	collected = std::move(c);
	return true;
}